

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

OpCode __thiscall ByteCodeGenerator::ToChkUndeclOp(ByteCodeGenerator *this,OpCode op)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  int iVar5;
  undefined6 in_register_00000032;
  
  iVar5 = (int)CONCAT62(in_register_00000032,op);
  if (iVar5 < 0x142) {
    if (iVar5 == 0x94) {
      return StEnvSlotChkUndecl;
    }
    if (iVar5 == 0x95) {
      return StInnerSlotChkUndecl;
    }
    if (iVar5 == 0x96) {
      return StLocalSlotChkUndecl;
    }
switchD_00806adf_caseD_143:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x131,"(false)","Unknown opcode for chk undecl mapping");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    OVar3 = InvalidOpCode;
  }
  else {
    switch(iVar5) {
    case 0x142:
      OVar3 = StParamSlotChkUndecl;
      break;
    default:
      goto switchD_00806adf_caseD_143;
    case 0x147:
      OVar3 = StObjSlotChkUndecl;
      break;
    case 0x148:
      OVar3 = StInnerObjSlotChkUndecl;
      break;
    case 0x149:
      OVar3 = StLocalObjSlotChkUndecl;
      break;
    case 0x14a:
      OVar3 = StParamObjSlotChkUndecl;
      break;
    case 0x14d:
      OVar3 = StEnvObjSlotChkUndecl;
    }
  }
  return OVar3;
}

Assistant:

Js::OpCode ByteCodeGenerator::ToChkUndeclOp(Js::OpCode op) const
{
    switch (op)
    {
    case Js::OpCode::StLocalSlot:
        return Js::OpCode::StLocalSlotChkUndecl;

    case Js::OpCode::StParamSlot:
        return Js::OpCode::StParamSlotChkUndecl;

    case Js::OpCode::StInnerSlot:
        return Js::OpCode::StInnerSlotChkUndecl;

    case Js::OpCode::StEnvSlot:
        return Js::OpCode::StEnvSlotChkUndecl;

    case Js::OpCode::StObjSlot:
        return Js::OpCode::StObjSlotChkUndecl;

    case Js::OpCode::StLocalObjSlot:
        return Js::OpCode::StLocalObjSlotChkUndecl;

    case Js::OpCode::StParamObjSlot:
        return Js::OpCode::StParamObjSlotChkUndecl;

    case Js::OpCode::StInnerObjSlot:
        return Js::OpCode::StInnerObjSlotChkUndecl;

    case Js::OpCode::StEnvObjSlot:
        return Js::OpCode::StEnvObjSlotChkUndecl;

    default:
        AssertMsg(false, "Unknown opcode for chk undecl mapping");
        return Js::OpCode::InvalidOpCode;
    }
}